

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_resolver.hpp
# Opt level: O0

results_type * __thiscall
asio::ip::basic_resolver<asio::ip::tcp,_asio::any_io_executor>::resolve
          (results_type *__return_storage_ptr__,
          basic_resolver<asio::ip::tcp,_asio::any_io_executor> *this,string_view host,
          string_view service,flags resolve_flags)

{
  service_type *this_00;
  implementation_type *piVar1;
  allocator<char> local_111;
  string local_110;
  allocator<char> local_d9;
  string local_d8;
  undefined1 local_b8 [8];
  basic_resolver_query<asio::ip::tcp> q;
  error_code ec;
  basic_resolver<asio::ip::tcp,_asio::any_io_executor> *this_local;
  string_view service_local;
  string_view host_local;
  results_type *r;
  
  service_local._M_len = (size_t)service._M_str;
  this_local = (basic_resolver<asio::ip::tcp,_asio::any_io_executor> *)service._M_len;
  service_local._M_str = (char *)host._M_len;
  std::error_code::error_code((error_code *)((long)&q.service_name_.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_d8,
             (basic_string_view<char,_std::char_traits<char>_> *)&service_local._M_str,&local_d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_110,(basic_string_view<char,_std::char_traits<char>_> *)&this_local,
             &local_111);
  basic_resolver_query<asio::ip::tcp>::basic_resolver_query
            ((basic_resolver_query<asio::ip::tcp> *)local_b8,&local_d8,&local_110,resolve_flags);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator(&local_111);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator(&local_d9);
  this_00 = asio::detail::
            io_object_impl<asio::detail::resolver_service<asio::ip::tcp>,_asio::any_io_executor>::
            get_service(&this->impl_);
  piVar1 = asio::detail::
           io_object_impl<asio::detail::resolver_service<asio::ip::tcp>,_asio::any_io_executor>::
           get_implementation(&this->impl_);
  asio::detail::resolver_service<asio::ip::tcp>::resolve
            (__return_storage_ptr__,this_00,piVar1,(query_type *)local_b8,
             (error_code *)((long)&q.service_name_.field_2 + 8));
  asio::detail::throw_error((error_code *)((long)&q.service_name_.field_2 + 8),"resolve");
  basic_resolver_query<asio::ip::tcp>::~basic_resolver_query
            ((basic_resolver_query<asio::ip::tcp> *)local_b8);
  return __return_storage_ptr__;
}

Assistant:

results_type resolve(ASIO_STRING_VIEW_PARAM host,
      ASIO_STRING_VIEW_PARAM service, resolver_base::flags resolve_flags)
  {
    asio::error_code ec;
    basic_resolver_query<protocol_type> q(static_cast<std::string>(host),
        static_cast<std::string>(service), resolve_flags);
    results_type r = impl_.get_service().resolve(
        impl_.get_implementation(), q, ec);
    asio::detail::throw_error(ec, "resolve");
    return r;
  }